

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fastpfor.cpp
# Opt level: O0

void __thiscall
FastPForLib::FastPForTest_adHocNumbers64_Test::~FastPForTest_adHocNumbers64_Test
          (FastPForTest_adHocNumbers64_Test *this)

{
  void *in_RDI;
  
  ~FastPForTest_adHocNumbers64_Test((FastPForTest_adHocNumbers64_Test *)0x12e388);
  operator_delete(in_RDI,0x80);
  return;
}

Assistant:

TEST_P(FastPForTest, adHocNumbers64) {
    int64_t data[] = {
                -3673975021604308289,
                277811506958363848,
                -7625128575524920515,
                -3321922176697690625,
                -8484521102416600502,
                4879706116117661039,
                3108316356327171753,
                -5023690236249800232};

    in64.clear();
    for (int i = 0; i < 64; ++i) {
      for (int j = 0; j < 4; ++j) {
        in64.push_back(data[j]);
      }
    }
    _verify64();
  }